

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<long>::SolveEigensystemJacobi
          (TPZMatrix<long> *this,int64_t *numiterations,REAL *tol,TPZVec<long> *Eigenvalues,
          TPZFMatrix<long> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong row;
  bool bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long *plVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t i;
  int64_t i_4;
  int64_t j;
  ulong uVar10;
  TPZFNMatrix<3,_long> VecIni;
  TPZFNMatrix<9,_long> Matrix;
  TPZFNMatrix<3,_long> VecIni_cp;
  double local_460;
  ulong local_458;
  long local_3f8;
  TPZFNMatrix<3,_long> local_3e0;
  TPZFMatrix<long> local_330;
  long local_2a0 [10];
  TPZFMatrix<long> local_250;
  long local_1c0 [10];
  TPZFNMatrix<3,_long> local_170;
  TPZFMatrix<long> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  local_250.fElem = local_1c0;
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186e1a8;
  local_250.fSize = 9;
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = row;
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = row;
  local_250.fGiven = local_250.fElem;
  TPZVec<int>::TPZVec(&local_250.fPivot.super_TPZVec<int>,0);
  local_250.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_250.fPivot.super_TPZVec<int>.fStore = local_250.fPivot.fExtAlloc;
  local_250.fPivot.super_TPZVec<int>.fNElements = 0;
  local_250.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_250.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  local_250.fWork.fStore = (long *)0x0;
  local_250.fWork.fNElements = 0;
  local_250.fWork.fNAlloc = 0;
  plVar8 = (long *)0x0;
  if ((row != 0) && (uVar7 = row * row, plVar8 = local_250.fElem, 9 < uVar7)) {
    plVar8 = (long *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
  }
  local_250.fElem = plVar8;
  local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186deb8;
  if (0 < (long)row) {
    uVar7 = 0;
    do {
      uVar10 = 0;
      do {
        iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                          (this,uVar7,uVar10);
        if ((local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           (local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <= (long)uVar10)) {
          TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_250.fElem[local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow * uVar10 + uVar7] =
             CONCAT44(extraout_var,iVar6);
        uVar10 = uVar10 + 1;
      } while (row != uVar10);
      uVar7 = uVar7 + 1;
    } while (uVar7 != row);
  }
  bVar5 = SolveEigenvaluesJacobi(&local_250.super_TPZMatrix<long>,numiterations,tol,Eigenvalues);
  if (bVar5) {
    local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZFNMatrix<3,_long>::TPZFNMatrix(&local_3e0,row,1,(long *)&local_330);
    local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZFNMatrix<3,_long>::TPZFNMatrix(&local_170,row,1,(long *)&local_330);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)row) {
      local_458 = 0;
      do {
        uVar7 = 0;
        do {
          iVar6 = rand();
          local_3e0.super_TPZFMatrix<long>.fElem[uVar7] = (long)iVar6;
          uVar7 = uVar7 + 1;
        } while (row != uVar7);
        TPZFMatrix<long>::TPZFMatrix(&local_c0,this);
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = 0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = 0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0186e1a8;
        local_330.fSize = 9;
        local_330.fElem = local_2a0;
        local_330.fGiven = local_2a0;
        TPZVec<int>::TPZVec(&local_330.fPivot.super_TPZVec<int>,0);
        local_330.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_330.fPivot.super_TPZVec<int>.fStore = local_330.fPivot.fExtAlloc;
        local_330.fPivot.super_TPZVec<int>.fNElements = 0;
        local_330.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_330.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
        local_330.fWork.fNAlloc = 0;
        local_330.fWork.fStore = (long *)0x0;
        local_330.fWork.fNElements = 0;
        local_330.fElem = (long *)0x0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_0186deb8;
        TPZFMatrix<long>::operator=(&local_330,&local_c0);
        TPZFMatrix<long>::~TPZFMatrix(&local_c0);
        lVar9 = ReturnNearestValue(Eigenvalues->fStore[local_458],Eigenvalues,0);
        dVar4 = ABS((double)(lVar9 - Eigenvalues->fStore[local_458]));
        if (dVar4 <= 1e-05) {
          uVar7 = 0;
          do {
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar7,uVar7);
            local_330.fElem
            [(uVar7 & 0xffffffff) * local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow + uVar7
            ] = CONCAT44(extraout_var_01,iVar6) - Eigenvalues->fStore[local_458];
            uVar7 = uVar7 + 1;
          } while (row != uVar7);
        }
        else {
          uVar7 = 0;
          do {
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar7,uVar7);
            local_330.fElem
            [(uVar7 & 0xffffffff) * local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow + uVar7
            ] = (CONCAT44(extraout_var_00,iVar6) + (long)(dVar4 * 0.01)) -
                Eigenvalues->fStore[local_458];
            uVar7 = uVar7 + 1;
          } while (row != uVar7);
        }
        local_460 = 0.0;
        uVar7 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <=
               (long)uVar7) ||
             (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1))
          {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <=
               (long)uVar7) ||
             (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1))
          {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_460 = local_460 +
                      ABS((double)local_3e0.super_TPZFMatrix<long>.fElem[uVar7]) *
                      ABS((double)local_3e0.super_TPZFMatrix<long>.fElem[uVar7]);
          uVar7 = uVar7 + 1;
        } while (row != uVar7);
        if (local_460 < 0.0) {
          local_460 = sqrt(local_460);
        }
        else {
          local_460 = SQRT(local_460);
        }
        uVar7 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <=
               (long)uVar7) ||
             (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1))
          {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <=
               (long)uVar7) ||
             (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1))
          {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_3e0.super_TPZFMatrix<long>.fElem[uVar7] =
               local_3e0.super_TPZFMatrix<long>.fElem[uVar7] / (long)local_460;
          uVar7 = uVar7 + 1;
        } while (row != uVar7);
        if (-1 < lVar2 && dVar1 < 10.0) {
          local_3f8 = 0;
          do {
            uVar7 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_170.super_TPZFMatrix<long>.fElem[uVar7] =
                   local_3e0.super_TPZFMatrix<long>.fElem[uVar7];
              uVar7 = uVar7 + 1;
            } while (row != uVar7);
            iVar6 = (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_330);
            if (iVar6 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar6 = (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_330);
            if (iVar6 != 0) {
              (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x43])(&local_330);
            }
            local_460 = 0.0;
            uVar7 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_460 = local_460 +
                          ABS((double)local_3e0.super_TPZFMatrix<long>.fElem[uVar7]) *
                          ABS((double)local_3e0.super_TPZFMatrix<long>.fElem[uVar7]);
              uVar7 = uVar7 + 1;
            } while (row != uVar7);
            if (local_460 < 0.0) {
              dVar4 = sqrt(local_460);
            }
            else {
              dVar4 = SQRT(local_460);
            }
            local_460 = 0.0;
            uVar7 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3e0.super_TPZFMatrix<long>.fElem[uVar7] =
                   local_3e0.super_TPZFMatrix<long>.fElem[uVar7] / (long)dVar4;
              if ((local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_170.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow
                   <= (long)uVar7) ||
                 (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <
                  1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_460 = local_460 +
                          ABS((double)((local_170.super_TPZFMatrix<long>.fElem[uVar7] -
                                       local_3e0.super_TPZFMatrix<long>.fElem[uVar7]) *
                                      (local_170.super_TPZFMatrix<long>.fElem[uVar7] -
                                      local_3e0.super_TPZFMatrix<long>.fElem[uVar7])));
              uVar7 = uVar7 + 1;
            } while (row != uVar7);
            if (local_460 < 0.0) {
              local_460 = sqrt(local_460);
            }
            else {
              local_460 = SQRT(local_460);
            }
          } while ((dVar1 < local_460) &&
                  (bVar3 = local_3f8 < lVar2, local_3f8 = local_3f8 + 1, bVar3));
        }
        uVar7 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <=
               (long)uVar7) ||
             (local_3e0.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1))
          {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = local_3e0.super_TPZFMatrix<long>.fElem[uVar7];
          if (ABS((double)lVar9) < 1e-05) {
            lVar9 = 0;
          }
          if (((Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow <= (long)local_458) ||
             ((Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem
          [(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * uVar7 + local_458] =
               lVar9;
          uVar7 = uVar7 + 1;
        } while (row != uVar7);
        TPZFMatrix<long>::~TPZFMatrix(&local_330,&PTR_PTR_0186e170);
        local_458 = local_458 + 1;
      } while (local_458 != row);
    }
    TPZFMatrix<long>::~TPZFMatrix(&local_170.super_TPZFMatrix<long>,&PTR_PTR_0186eb30);
    TPZFMatrix<long>::~TPZFMatrix(&local_3e0.super_TPZFMatrix<long>,&PTR_PTR_0186eb30);
  }
  TPZFMatrix<long>::~TPZFMatrix(&local_250,&PTR_PTR_0186e170);
  return bVar5;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}